

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::DefaultForField_abi_cxx11_
          (string *__return_storage_ptr__,php *this,FieldDescriptor *field)

{
  Type TVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  TVar1 = FieldDescriptor::type((FieldDescriptor *)this);
  switch(TVar1) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
    pcVar3 = "0.0";
    paVar2 = &local_a;
    break;
  case TYPE_INT64:
  case TYPE_UINT64:
  case TYPE_INT32:
  case TYPE_FIXED64:
  case TYPE_FIXED32:
  case TYPE_UINT32:
  case TYPE_ENUM:
  case TYPE_SFIXED32:
  case TYPE_SFIXED64:
  case TYPE_SINT32:
  case MAX_TYPE:
    pcVar3 = "0";
    paVar2 = &local_9;
    break;
  case TYPE_BOOL:
    pcVar3 = "false";
    paVar2 = &local_b;
    break;
  case TYPE_STRING:
  case TYPE_BYTES:
    pcVar3 = "\'\'";
    paVar2 = &local_c;
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    pcVar3 = "null";
    paVar2 = &local_d;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/php/php_generator.cc"
                  ,0xc6,
                  "std::string google::protobuf::compiler::php::DefaultForField(const FieldDescriptor *)"
                 );
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultForField(const FieldDescriptor* field) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
    case FieldDescriptor::TYPE_ENUM: return "0";
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT: return "0.0";
    case FieldDescriptor::TYPE_BOOL: return "false";
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: return "''";
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP: return "null";
    default: assert(false); return "";
  }
}